

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

double __thiscall ipx::Basis::DensityInverse(Basis *this)

{
  int iVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> rowcounts;
  allocator_type local_39;
  double local_38;
  vector<int,_std::allocator<int>_> local_30;
  
  iVar1 = this->model_->num_rows_;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,(long)iVar1,&local_39);
  ipx::SymbolicInvert(this->model_,&this->basis_,
                      local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,(Int *)0x0);
  if (iVar1 < 1) {
    local_38 = 0.0;
    if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (Int *)0x0) goto LAB_003900a1;
  }
  else {
    local_38 = 0.0;
    sVar2 = 0;
    do {
      local_38 = local_38 +
                 (double)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar2] / (double)iVar1;
      sVar2 = sVar2 + 1;
    } while ((long)iVar1 != sVar2);
  }
  operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_003900a1:
  return local_38 / (double)iVar1;
}

Assistant:

double Basis::DensityInverse() const {
    Int m = model_.rows();
    std::vector<Int> rowcounts(m);
    SymbolicInvert(rowcounts.data(), nullptr);
    // Accumulating rowcounts would result in overflow for large LPs.
    double density = 0.0;
    for (Int i = 0; i < m; i++)
        density += 1.0*rowcounts[i]/m;
    return density/m;
}